

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_handle.cpp
# Opt level: O0

SysCallInt32Result cppnet::OsHandle::Connect(int64_t sockfd,Address *address)

{
  SysCallInt32Result SVar1;
  uint16_t uVar2;
  AddressType AVar3;
  char *pcVar4;
  int *piVar5;
  undefined1 local_50 [8];
  sockaddr_in6 addr_1;
  sockaddr_in addr;
  int32_t ret;
  Address *address_local;
  int64_t sockfd_local;
  
  AVar3 = Address::GetType(address);
  if (AVar3 == AT_IPV4) {
    addr_1.sin6_addr.__in6_u.__u6_addr16[6] = 2;
    uVar2 = Address::GetAddrPort(address);
    addr_1.sin6_addr.__in6_u.__u6_addr16[7] = htons(uVar2);
    Address::GetIp_abi_cxx11_(address);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    addr_1.sin6_scope_id = inet_addr(pcVar4);
    addr.sin_zero._0_4_ =
         connect((int)sockfd,(sockaddr *)((long)&addr_1.sin6_addr.__in6_u + 0xc),0x10);
  }
  else {
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    addr_1.sin6_addr.__in6_u.__u6_addr32[2] = 0;
    local_50._0_2_ = 10;
    uVar2 = Address::GetAddrPort(address);
    local_50._2_2_ = htons(uVar2);
    Address::GetIp_abi_cxx11_(address);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    inet_pton(10,pcVar4,&addr_1);
    addr.sin_zero._0_4_ = connect((int)sockfd,(sockaddr *)local_50,0x1c);
  }
  if ((int)addr.sin_zero._0_4_ < 0) {
    piVar5 = __errno_location();
    sockfd_local._4_4_ = *piVar5;
  }
  else {
    sockfd_local._4_4_ = 0;
  }
  SVar1._errno = sockfd_local._4_4_;
  SVar1._return_value._0_1_ = addr.sin_zero[0];
  SVar1._return_value._1_1_ = addr.sin_zero[1];
  SVar1._return_value._2_1_ = addr.sin_zero[2];
  SVar1._return_value._3_1_ = addr.sin_zero[3];
  return SVar1;
}

Assistant:

SysCallInt32Result OsHandle::Connect(int64_t sockfd, Address& address) {
    int32_t ret = -1;
    if (address.GetType() == AT_IPV4) {
        struct sockaddr_in addr;
        addr.sin_family = AF_INET;
        addr.sin_port = htons(address.GetAddrPort());
        addr.sin_addr.s_addr = inet_addr(address.GetIp().c_str());
        ret = connect(sockfd, (sockaddr *)&addr, sizeof(addr));

    } else {
        struct sockaddr_in6 addr;
        addr.sin6_flowinfo = 0;
        addr.sin6_scope_id = 0;
        addr.sin6_family = AF_INET6;
        addr.sin6_port = htons(address.GetAddrPort());
        inet_pton(AF_INET6, address.GetIp().c_str(), &addr.sin6_addr);
        ret = connect(sockfd, (sockaddr *)&addr, sizeof(addr));
    }

    if (ret < 0) {
        return {ret, errno};
    }
    return {ret, 0};
}